

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# ttgxvar.c
# Opt level: O3

FT_Error TT_Vary_Apply_Glyph_Deltas(TT_Loader loader,FT_Outline *outline,FT_Vector *unrounded)

{
  long *plVar1;
  undefined8 *puVar2;
  undefined8 *puVar3;
  long *plVar4;
  ushort uVar5;
  TT_Face pTVar6;
  FT_ULong FVar7;
  FT_ULong pos;
  long lVar8;
  FT_UInt delta_cnt;
  undefined8 uVar9;
  FT_Pos FVar10;
  FT_Stream pFVar11;
  GX_Blend pGVar12;
  FT_Fixed *pFVar13;
  FT_UInt16 FVar14;
  FT_UInt16 FVar15;
  FT_Vector *pFVar16;
  FT_Vector *pFVar17;
  uchar *puVar18;
  uchar *puVar19;
  FT_Memory pFVar20;
  FT_Bool *pFVar21;
  long lVar22;
  long lVar23;
  ulong uVar24;
  uint uVar25;
  int iVar26;
  FT_UShort *P;
  long lVar27;
  ulong uVar28;
  uint uVar29;
  FT_Fixed *pFVar30;
  FT_Error error;
  FT_UInt spoint_count;
  FT_UInt point_count;
  FT_Error local_124;
  FT_Memory local_120;
  FT_UInt local_114;
  FT_Fixed *local_110;
  FT_Stream local_108;
  FT_Vector *local_100;
  GX_Blend local_f8;
  FT_Pointer local_f0;
  ulong local_e8;
  FT_Vector *local_e0;
  FT_UInt16 local_d2;
  FT_Pointer local_d0;
  FT_Bool *local_c8;
  FT_UShort *local_c0;
  FT_Fixed *local_b8;
  ulong local_b0;
  ulong local_a8;
  FT_Outline *local_a0;
  FT_UInt local_98;
  uint local_94;
  FT_UShort *local_90;
  FT_Fixed *local_88;
  FT_Fixed *local_80;
  FT_UShort *local_78;
  FT_Fixed local_70;
  ulong local_68;
  ulong local_60;
  TT_Loader local_58;
  long local_50;
  long local_48;
  uchar *local_40;
  uchar *local_38;
  
  pTVar6 = loader->face;
  local_108 = (pTVar6->root).stream;
  local_120 = local_108->memory;
  uVar25 = loader->glyph_index;
  local_a8 = (ulong)(uint)(int)outline->n_points;
  local_f8 = pTVar6->blend;
  local_98 = 0;
  if (local_f8 == (GX_Blend)0x0 || pTVar6->doblend == '\0') {
    return 6;
  }
  uVar29 = (int)outline->n_points + 4;
  if (uVar29 != 0) {
    pFVar16 = outline->points;
    lVar22 = 0;
    do {
      plVar4 = (long *)((long)&pFVar16->x + lVar22);
      lVar23 = plVar4[1];
      plVar1 = (long *)((long)&unrounded->x + lVar22);
      *plVar1 = *plVar4 << 6;
      plVar1[1] = lVar23 << 6;
      lVar22 = lVar22 + 0x10;
    } while ((ulong)uVar29 << 4 != lVar22);
  }
  if (local_f8->gv_glyphcnt <= uVar25) {
    return 0;
  }
  if (local_f8->glyphoffsets[uVar25] == local_f8->glyphoffsets[(ulong)uVar25 + 1]) {
    return 0;
  }
  uVar24 = (ulong)uVar29;
  local_c8 = (FT_Bool *)0x0;
  local_a0 = outline;
  local_58 = loader;
  pFVar16 = (FT_Vector *)ft_mem_realloc(local_120,0x10,0,uVar24,(void *)0x0,&local_124);
  pFVar20 = local_120;
  pFVar17 = (FT_Vector *)0x0;
  if (local_124 != 0) goto LAB_00259070;
  local_114 = uVar29;
  local_100 = pFVar16;
  pFVar17 = (FT_Vector *)ft_mem_realloc(local_120,0x10,0,uVar24,(void *)0x0,&local_124);
  if (local_124 != 0) {
    local_c8 = (FT_Bool *)0x0;
    pFVar16 = local_100;
    goto LAB_00259070;
  }
  local_e0 = pFVar17;
  local_c8 = (FT_Bool *)ft_mem_realloc(pFVar20,1,0,uVar24,(void *)0x0,&local_124);
  pFVar11 = local_108;
  pFVar16 = local_100;
  pFVar20 = local_120;
  pFVar17 = local_e0;
  if (local_124 != 0) goto LAB_00259070;
  FVar7 = local_f8->glyphoffsets[(ulong)uVar25 + 1];
  pos = local_f8->glyphoffsets[uVar25];
  local_124 = FT_Stream_Seek(local_108,pos);
  pFVar16 = local_100;
  pFVar20 = local_120;
  pFVar17 = local_e0;
  if (local_124 != 0) goto LAB_00259070;
  pFVar30 = (FT_Fixed *)(FVar7 - pos);
  local_124 = FT_Stream_EnterFrame(pFVar11,(FT_ULong)pFVar30);
  pGVar12 = local_f8;
  pFVar20 = local_120;
  pFVar16 = local_100;
  pFVar17 = local_e0;
  if (local_124 != 0) goto LAB_00259070;
  puVar19 = pFVar11->cursor;
  puVar18 = pFVar11->base;
  local_80 = (FT_Fixed *)0x0;
  local_110 = pFVar30;
  local_e8 = uVar24;
  local_88 = (FT_Fixed *)
             ft_mem_realloc(local_120,8,0,(ulong)local_f8->num_axis,(void *)0x0,&local_124);
  pFVar30 = (FT_Fixed *)0x0;
  P = (FT_UShort *)0x0;
  if (local_124 == 0) {
    local_b0 = (long)puVar19 - (long)puVar18;
    local_80 = (FT_Fixed *)
               ft_mem_realloc(pFVar20,8,0,(ulong)pGVar12->num_axis,(void *)0x0,&local_124);
    if (local_124 != 0) {
      pFVar30 = (FT_Fixed *)0x0;
      P = (FT_UShort *)0x0;
      goto LAB_0025901c;
    }
    local_b8 = (FT_Fixed *)
               ft_mem_realloc(local_120,8,0,(ulong)pGVar12->num_axis,(void *)0x0,&local_124);
    pFVar11 = local_108;
    if (local_124 != 0) {
      pFVar30 = local_b8;
      P = (FT_UShort *)0x0;
      goto LAB_0025901c;
    }
    FVar14 = FT_Stream_GetUShort(local_108);
    FVar15 = FT_Stream_GetUShort(pFVar11);
    pFVar11 = local_108;
    if ((local_110 < (FT_Fixed *)(ulong)FVar15) ||
       (local_60 = (ulong)(FVar14 & 0xfff), local_110 < (FT_Fixed *)(ulong)((FVar14 & 0xfff) * 4)))
    {
      local_124 = 8;
      pFVar30 = local_b8;
      P = (FT_UShort *)0x0;
      goto LAB_0025901c;
    }
    local_b0 = local_b0 + (long)(ulong)FVar15;
    if ((short)FVar14 < 0) {
      puVar19 = local_108->base;
      uVar24 = (long)local_108->cursor - (long)puVar19;
      puVar18 = puVar19 + local_b0;
      if ((ulong)((long)local_108->limit - (long)puVar19) <= local_b0) {
        puVar18 = local_108->limit;
      }
      local_108->cursor = puVar18;
      local_78 = ft_var_readpackedpoints(local_108,local_f8->gvar_size,&local_98);
      puVar19 = pFVar11->base;
      local_b0 = (long)pFVar11->cursor - (long)puVar19;
      puVar18 = puVar19 + uVar24;
      if ((ulong)((long)pFVar11->limit - (long)puVar19) <= uVar24) {
        puVar18 = pFVar11->limit;
      }
      pFVar11->cursor = puVar18;
    }
    else {
      local_78 = (FT_UShort *)0x0;
    }
    local_f0 = (FT_Pointer)0x0;
    local_d0 = ft_mem_realloc(local_120,8,0,local_e8,(void *)0x0,&local_124);
    if ((local_124 == 0) &&
       (local_f0 = ft_mem_realloc(local_120,8,0,local_e8,(void *)0x0,&local_124), local_124 == 0)) {
      if (local_114 != 0) {
        pFVar16 = local_a0->points;
        lVar22 = 0;
        do {
          plVar4 = (long *)((long)&pFVar16->x + lVar22);
          lVar23 = plVar4[1];
          plVar1 = (long *)((long)&local_100->x + lVar22);
          *plVar1 = *plVar4 << 0x10;
          plVar1[1] = lVar23 << 0x10;
          lVar22 = lVar22 + 0x10;
        } while (local_e8 << 4 != lVar22);
      }
      if ((uint)local_60 != 0) {
        local_48 = local_e8 << 4;
        local_50 = local_e8 * 8;
        local_68 = 0;
        local_c0 = (FT_UShort *)0x0;
        do {
          pFVar11 = local_108;
          local_d2 = FT_Stream_GetUShort(local_108);
          FVar14 = FT_Stream_GetUShort(pFVar11);
          pFVar30 = local_88;
          pGVar12 = local_f8;
          pFVar11 = local_108;
          local_110 = (FT_Fixed *)CONCAT44(local_110._4_4_,(uint)FVar14);
          if ((short)FVar14 < 0) {
            if (local_f8->num_axis != 0) {
              uVar24 = 0;
              do {
                FVar14 = FT_Stream_GetUShort(pFVar11);
                pFVar30[uVar24] = (long)(short)FVar14 << 2;
                uVar24 = uVar24 + 1;
              } while (uVar24 < pGVar12->num_axis);
            }
          }
          else {
            uVar25 = FVar14 & 0xfff;
            if (local_f8->tuplecount <= uVar25) {
              local_124 = 8;
              goto LAB_0025919f;
            }
            memcpy(local_88,local_f8->tuplecoords + uVar25 * local_f8->num_axis,
                   (ulong)local_f8->num_axis << 3);
          }
          pFVar13 = local_80;
          pFVar11 = local_108;
          pFVar30 = local_b8;
          if ((((uint)local_110 >> 0xe & 1) != 0) && (pGVar12->num_axis != 0)) {
            uVar24 = 0;
            do {
              FVar14 = FT_Stream_GetUShort(pFVar11);
              pFVar30 = local_b8;
              pFVar13[uVar24] = (long)(short)FVar14 << 2;
              uVar24 = uVar24 + 1;
            } while (uVar24 < pGVar12->num_axis);
            if (pGVar12->num_axis != 0) {
              uVar24 = 0;
              do {
                FVar14 = FT_Stream_GetUShort(local_108);
                pFVar30[uVar24] = (long)(short)FVar14 << 2;
                uVar24 = uVar24 + 1;
              } while (uVar24 < pGVar12->num_axis);
            }
          }
          local_70 = ft_var_apply_tuple(pGVar12,(FT_UShort)local_110,local_88,local_80,pFVar30);
          if (local_70 != 0) {
            local_40 = local_108->base;
            local_38 = local_108->cursor;
            puVar19 = local_40 + local_b0;
            if ((ulong)((long)local_108->limit - (long)local_40) <= local_b0) {
              puVar19 = local_108->limit;
            }
            local_108->cursor = puVar19;
            if (((uint)local_110 >> 0xd & 1) == 0) {
              local_94 = local_98;
              local_90 = local_78;
            }
            else {
              local_90 = ft_var_readpackedpoints(local_108,local_f8->gvar_size,&local_94);
              local_c0 = local_90;
            }
            uVar25 = local_94;
            pGVar12 = local_f8;
            pFVar11 = local_108;
            delta_cnt = local_94;
            if (local_94 == 0) {
              delta_cnt = local_114;
            }
            local_110 = ft_var_readpackeddeltas(local_108,local_f8->gvar_size,delta_cnt);
            pFVar30 = ft_var_readpackeddeltas(pFVar11,pGVar12->gvar_size,delta_cnt);
            pFVar17 = local_e0;
            pFVar16 = local_100;
            if (((local_90 != (FT_UShort *)0x0) && (pFVar30 != (FT_Fixed *)0x0)) &&
               (local_110 != (FT_Fixed *)0x0)) {
              if (local_90 == (FT_UShort *)0xffffffffffffffff) {
                if (local_114 != 0) {
                  uVar24 = 0;
                  do {
                    lVar23 = (long)(int)local_110[uVar24] * (long)(int)local_70;
                    lVar27 = (long)(int)pFVar30[uVar24] * (long)(int)local_70;
                    lVar22 = *(long *)((long)local_f0 + uVar24 * 8);
                    plVar4 = (long *)((long)local_d0 + uVar24 * 8);
                    *plVar4 = *plVar4 + (long)(int)((ulong)(lVar23 + 0x8000 + (lVar23 >> 0x3f)) >>
                                                   0x10);
                    *(long *)((long)local_f0 + uVar24 * 8) =
                         (int)((ulong)(lVar27 + 0x8000 + (lVar27 >> 0x3f)) >> 0x10) + lVar22;
                    uVar24 = uVar24 + 1;
                  } while (local_e8 != uVar24);
                }
              }
              else {
                if (local_114 != 0) {
                  lVar22 = 0;
                  pFVar21 = local_c8;
                  do {
                    *pFVar21 = '\0';
                    puVar2 = (undefined8 *)((long)&local_100->x + lVar22);
                    uVar9 = puVar2[1];
                    puVar3 = (undefined8 *)((long)&local_e0->x + lVar22);
                    *puVar3 = *puVar2;
                    puVar3[1] = uVar9;
                    pFVar21 = pFVar21 + 1;
                    lVar22 = lVar22 + 0x10;
                  } while (local_48 != lVar22);
                }
                if (uVar25 != 0) {
                  uVar24 = 0;
                  do {
                    uVar5 = local_90[uVar24];
                    if (uVar5 < local_114) {
                      local_c8[uVar5] = '\x01';
                      lVar22 = (long)(int)local_110[uVar24] * (long)(int)local_70;
                      local_e0[uVar5].x =
                           local_e0[uVar5].x +
                           (long)(int)((ulong)(lVar22 + 0x8000 + (lVar22 >> 0x3f)) >> 0x10);
                      lVar22 = (long)(int)pFVar30[uVar24] * (long)(int)local_70;
                      local_e0[uVar5].y =
                           local_e0[uVar5].y +
                           (long)(int)((ulong)(lVar22 + 0x8000 + (lVar22 >> 0x3f)) >> 0x10);
                    }
                    uVar24 = uVar24 + 1;
                  } while (uVar25 != uVar24);
                }
                tt_interpolate_deltas(local_a0,local_e0,local_100,local_c8);
                if (local_114 != 0) {
                  lVar22 = 0;
                  do {
                    lVar23 = *(long *)((long)&pFVar17->y + lVar22 * 2);
                    lVar27 = *(long *)((long)local_f0 + lVar22);
                    lVar8 = *(long *)((long)&pFVar16->y + lVar22 * 2);
                    *(long *)((long)local_d0 + lVar22) =
                         (*(long *)((long)&pFVar17->x + lVar22 * 2) +
                         *(long *)((long)local_d0 + lVar22)) -
                         *(long *)((long)&pFVar16->x + lVar22 * 2);
                    *(long *)((long)local_f0 + lVar22) = (lVar23 + lVar27) - lVar8;
                    lVar22 = lVar22 + 8;
                  } while (local_50 != lVar22);
                }
              }
            }
            if (local_c0 == (FT_UShort *)0xffffffffffffffff) {
              local_c0 = (FT_UShort *)0xffffffffffffffff;
            }
            else {
              ft_mem_free(local_120,local_c0);
              local_c0 = (FT_UShort *)0x0;
            }
            pFVar20 = local_120;
            uVar24 = (long)local_38 - (long)local_40;
            ft_mem_free(local_120,local_110);
            ft_mem_free(pFVar20,pFVar30);
            puVar19 = local_108->base + uVar24;
            if ((ulong)((long)local_108->limit - (long)local_108->base) <= uVar24) {
              puVar19 = local_108->limit;
            }
            local_108->cursor = puVar19;
          }
          local_b0 = local_b0 + local_d2;
          uVar25 = (int)local_68 + 1;
          local_68 = (ulong)uVar25;
        } while (uVar25 != (uint)local_60);
      }
      uVar25 = pTVar6->variation_support;
      uVar24 = local_a8 & 0xffffffff;
      iVar26 = (int)local_a8;
      if ((uVar25 & 2) != 0) {
        *(undefined8 *)((long)local_d0 + uVar24 * 8) = 0;
        *(undefined8 *)((long)local_f0 + uVar24 * 8) = 0;
        *(undefined8 *)((long)local_d0 + (ulong)(iVar26 + 1) * 8) = 0;
        *(undefined8 *)((long)local_f0 + (ulong)(iVar26 + 1) * 8) = 0;
      }
      if ((uVar25 & 0x10) != 0) {
        *(undefined8 *)((long)local_d0 + (ulong)(iVar26 + 2) * 8) = 0;
        *(undefined8 *)((long)local_f0 + (ulong)(iVar26 + 2) * 8) = 0;
        *(undefined8 *)((long)local_d0 + (ulong)(iVar26 + 3) * 8) = 0;
        *(undefined8 *)((long)local_f0 + (ulong)(iVar26 + 3) * 8) = 0;
      }
      if (local_114 != 0) {
        pFVar16 = local_a0->points;
        local_e8 = local_e8 << 3;
        uVar28 = 0;
        do {
          plVar4 = (long *)((long)&unrounded->x + uVar28 * 2);
          *plVar4 = *plVar4 + (*(long *)((long)local_d0 + uVar28) + 0x200 >> 10);
          plVar4 = (long *)((long)&unrounded->y + uVar28 * 2);
          *plVar4 = *plVar4 + (*(long *)((long)local_f0 + uVar28) + 0x200 >> 10);
          plVar4 = (long *)((long)&pFVar16->x + uVar28 * 2);
          *plVar4 = *plVar4 + ((*(long *)((long)local_d0 + uVar28) << 0x20) + 0x800000000000 >> 0x30
                              );
          plVar4 = (long *)((long)&pFVar16->y + uVar28 * 2);
          *plVar4 = *plVar4 + ((*(long *)((long)local_f0 + uVar28) << 0x20) + 0x800000000000 >> 0x30
                              );
          uVar28 = uVar28 + 8;
        } while (local_e8 != uVar28);
      }
      if ((uVar25 & 2) == 0) {
        FVar10 = local_a0->points[uVar24].y;
        (local_58->pp1).x = local_a0->points[uVar24].x;
        (local_58->pp1).y = FVar10;
        FVar10 = local_a0->points[iVar26 + 1U].y;
        (local_58->pp2).x = local_a0->points[iVar26 + 1U].x;
        (local_58->pp2).y = FVar10;
        local_58->linear = (FT_Int)((unrounded[iVar26 + 1U].x - unrounded[uVar24].x) + 0x20U >> 6);
        uVar25 = pTVar6->variation_support;
      }
      if ((uVar25 & 0x10) == 0) {
        FVar10 = local_a0->points[iVar26 + 2U].y;
        (local_58->pp3).x = local_a0->points[iVar26 + 2U].x;
        (local_58->pp3).y = FVar10;
        FVar10 = local_a0->points[iVar26 + 3U].y;
        (local_58->pp4).x = local_a0->points[iVar26 + 3U].x;
        (local_58->pp4).y = FVar10;
        local_58->vadvance =
             (FT_Int)((unrounded[iVar26 + 3U].y - unrounded[iVar26 + 2U].y) + 0x20U >> 6);
      }
    }
LAB_0025919f:
    pFVar20 = local_120;
    ft_mem_free(local_120,local_d0);
    ft_mem_free(pFVar20,local_f0);
    pFVar30 = local_b8;
    P = local_78;
    if (local_78 != (FT_UShort *)0xffffffffffffffff) goto LAB_0025901c;
  }
  else {
LAB_0025901c:
    ft_mem_free(local_120,P);
  }
  ft_mem_free(local_120,local_88);
  ft_mem_free(local_120,local_80);
  ft_mem_free(local_120,pFVar30);
  FT_Stream_ExitFrame(local_108);
  pFVar16 = local_100;
  pFVar20 = local_120;
  pFVar17 = local_e0;
LAB_00259070:
  ft_mem_free(pFVar20,pFVar16);
  ft_mem_free(pFVar20,pFVar17);
  ft_mem_free(pFVar20,local_c8);
  return local_124;
}

Assistant:

FT_LOCAL_DEF( FT_Error )
  TT_Vary_Apply_Glyph_Deltas( TT_Loader    loader,
                              FT_Outline*  outline,
                              FT_Vector*   unrounded )
  {
    FT_Error   error;
    TT_Face    face        = loader->face;
    FT_Stream  stream      = face->root.stream;
    FT_Memory  memory      = stream->memory;
    FT_UInt    glyph_index = loader->glyph_index;
    FT_UInt    n_points    = (FT_UInt)outline->n_points + 4;

    FT_Vector*  points_org = NULL;  /* coordinates in 16.16 format */
    FT_Vector*  points_out = NULL;  /* coordinates in 16.16 format */
    FT_Bool*    has_delta  = NULL;

    FT_ULong  glyph_start;

    FT_UInt   tupleCount;
    FT_ULong  offsetToData;
    FT_ULong  dataSize;

    FT_ULong  here;
    FT_UInt   i, j;

    FT_Fixed*  tuple_coords    = NULL;
    FT_Fixed*  im_start_coords = NULL;
    FT_Fixed*  im_end_coords   = NULL;

    GX_Blend  blend = face->blend;

    FT_UInt  point_count;
    FT_UInt  spoint_count = 0;

    FT_UShort*  sharedpoints = NULL;
    FT_UShort*  localpoints  = NULL;
    FT_UShort*  points;

    FT_Fixed*  deltas_x       = NULL;
    FT_Fixed*  deltas_y       = NULL;
    FT_Fixed*  point_deltas_x = NULL;
    FT_Fixed*  point_deltas_y = NULL;


    if ( !face->doblend || !blend )
      return FT_THROW( Invalid_Argument );

    for ( i = 0; i < n_points; i++ )
    {
      unrounded[i].x = INT_TO_F26DOT6( outline->points[i].x );
      unrounded[i].y = INT_TO_F26DOT6( outline->points[i].y );
    }

    if ( glyph_index >= blend->gv_glyphcnt      ||
         blend->glyphoffsets[glyph_index] ==
           blend->glyphoffsets[glyph_index + 1] )
    {
      FT_TRACE2(( "TT_Vary_Apply_Glyph_Deltas:"
                  " no variation data for glyph %d\n", glyph_index ));
      return FT_Err_Ok;
    }

    if ( FT_NEW_ARRAY( points_org, n_points ) ||
         FT_NEW_ARRAY( points_out, n_points ) ||
         FT_NEW_ARRAY( has_delta, n_points )  )
      goto Fail1;

    dataSize = blend->glyphoffsets[glyph_index + 1] -
                 blend->glyphoffsets[glyph_index];

    if ( FT_STREAM_SEEK( blend->glyphoffsets[glyph_index] ) ||
         FT_FRAME_ENTER( dataSize )                         )
      goto Fail1;

    glyph_start = FT_Stream_FTell( stream );

    /* each set of glyph variation data is formatted similarly to `cvar' */

    if ( FT_NEW_ARRAY( tuple_coords, blend->num_axis )    ||
         FT_NEW_ARRAY( im_start_coords, blend->num_axis ) ||
         FT_NEW_ARRAY( im_end_coords, blend->num_axis )   )
      goto Fail2;

    tupleCount   = FT_GET_USHORT();
    offsetToData = FT_GET_USHORT();

    /* rough sanity test */
    if ( offsetToData > dataSize                                ||
         ( tupleCount & GX_TC_TUPLE_COUNT_MASK ) * 4 > dataSize )
    {
      FT_TRACE2(( "TT_Vary_Apply_Glyph_Deltas:"
                  " invalid glyph variation array header\n" ));

      error = FT_THROW( Invalid_Table );
      goto Fail2;
    }

    offsetToData += glyph_start;

    if ( tupleCount & GX_TC_TUPLES_SHARE_POINT_NUMBERS )
    {
      here = FT_Stream_FTell( stream );

      FT_Stream_SeekSet( stream, offsetToData );

      sharedpoints = ft_var_readpackedpoints( stream,
                                              blend->gvar_size,
                                              &spoint_count );
      offsetToData = FT_Stream_FTell( stream );

      FT_Stream_SeekSet( stream, here );
    }

    FT_TRACE5(( "gvar: there %s %d tuple%s:\n",
                ( tupleCount & GX_TC_TUPLE_COUNT_MASK ) == 1 ? "is" : "are",
                tupleCount & GX_TC_TUPLE_COUNT_MASK,
                ( tupleCount & GX_TC_TUPLE_COUNT_MASK ) == 1 ? "" : "s" ));

    if ( FT_NEW_ARRAY( point_deltas_x, n_points ) ||
         FT_NEW_ARRAY( point_deltas_y, n_points ) )
      goto Fail3;

    for ( j = 0; j < n_points; j++ )
    {
      points_org[j].x = FT_intToFixed( outline->points[j].x );
      points_org[j].y = FT_intToFixed( outline->points[j].y );
    }

    for ( i = 0; i < ( tupleCount & GX_TC_TUPLE_COUNT_MASK ); i++ )
    {
      FT_UInt   tupleDataSize;
      FT_UInt   tupleIndex;
      FT_Fixed  apply;


      FT_TRACE6(( "  tuple %d:\n", i ));

      tupleDataSize = FT_GET_USHORT();
      tupleIndex    = FT_GET_USHORT();

      if ( tupleIndex & GX_TI_EMBEDDED_TUPLE_COORD )
      {
        for ( j = 0; j < blend->num_axis; j++ )
          tuple_coords[j] = FT_fdot14ToFixed( FT_GET_SHORT() );
      }
      else if ( ( tupleIndex & GX_TI_TUPLE_INDEX_MASK ) >= blend->tuplecount )
      {
        FT_TRACE2(( "TT_Vary_Apply_Glyph_Deltas:"
                    " invalid tuple index\n" ));

        error = FT_THROW( Invalid_Table );
        goto Fail3;
      }
      else
        FT_MEM_COPY(
          tuple_coords,
          blend->tuplecoords +
            ( tupleIndex & GX_TI_TUPLE_INDEX_MASK ) * blend->num_axis,
          blend->num_axis * sizeof ( FT_Fixed ) );

      if ( tupleIndex & GX_TI_INTERMEDIATE_TUPLE )
      {
        for ( j = 0; j < blend->num_axis; j++ )
          im_start_coords[j] = FT_fdot14ToFixed( FT_GET_SHORT() );
        for ( j = 0; j < blend->num_axis; j++ )
          im_end_coords[j] = FT_fdot14ToFixed( FT_GET_SHORT() );
      }

      apply = ft_var_apply_tuple( blend,
                                  (FT_UShort)tupleIndex,
                                  tuple_coords,
                                  im_start_coords,
                                  im_end_coords );

      if ( apply == 0 )              /* tuple isn't active for our blend */
      {
        offsetToData += tupleDataSize;
        continue;
      }

      here = FT_Stream_FTell( stream );

      FT_Stream_SeekSet( stream, offsetToData );

      if ( tupleIndex & GX_TI_PRIVATE_POINT_NUMBERS )
      {
        localpoints = ft_var_readpackedpoints( stream,
                                               blend->gvar_size,
                                               &point_count );
        points      = localpoints;
      }
      else
      {
        points      = sharedpoints;
        point_count = spoint_count;
      }

      deltas_x = ft_var_readpackeddeltas( stream,
                                          blend->gvar_size,
                                          point_count == 0 ? n_points
                                                           : point_count );
      deltas_y = ft_var_readpackeddeltas( stream,
                                          blend->gvar_size,
                                          point_count == 0 ? n_points
                                                           : point_count );

      if ( !points || !deltas_y || !deltas_x )
        ; /* failure, ignore it */

      else if ( points == ALL_POINTS )
      {
#ifdef FT_DEBUG_LEVEL_TRACE
        int  count = 0;
#endif


        FT_TRACE7(( "    point deltas:\n" ));

        /* this means that there are deltas for every point in the glyph */
        for ( j = 0; j < n_points; j++ )
        {
          FT_Fixed  old_point_delta_x = point_deltas_x[j];
          FT_Fixed  old_point_delta_y = point_deltas_y[j];

          FT_Fixed  point_delta_x = FT_MulFix( deltas_x[j], apply );
          FT_Fixed  point_delta_y = FT_MulFix( deltas_y[j], apply );


          point_deltas_x[j] = old_point_delta_x + point_delta_x;
          point_deltas_y[j] = old_point_delta_y + point_delta_y;

#ifdef FT_DEBUG_LEVEL_TRACE
          if ( point_delta_x || point_delta_y )
          {
            FT_TRACE7(( "      %d: (%f, %f) -> (%f, %f)\n",
                        j,
                        (double)( FT_intToFixed( outline->points[j].x ) +
                                    old_point_delta_x ) / 65536,
                        (double)( FT_intToFixed( outline->points[j].y ) +
                                    old_point_delta_y ) / 65536,
                        (double)( FT_intToFixed( outline->points[j].x ) +
                                    point_deltas_x[j] ) / 65536,
                        (double)( FT_intToFixed( outline->points[j].y ) +
                                    point_deltas_y[j] ) / 65536 ));
            count++;
          }
#endif
        }

#ifdef FT_DEBUG_LEVEL_TRACE
        if ( !count )
          FT_TRACE7(( "      none\n" ));
#endif
      }

      else
      {
#ifdef FT_DEBUG_LEVEL_TRACE
        int  count = 0;
#endif


        /* we have to interpolate the missing deltas similar to the */
        /* IUP bytecode instruction                                 */
        for ( j = 0; j < n_points; j++ )
        {
          has_delta[j]  = FALSE;
          points_out[j] = points_org[j];
        }

        for ( j = 0; j < point_count; j++ )
        {
          FT_UShort  idx = points[j];


          if ( idx >= n_points )
            continue;

          has_delta[idx] = TRUE;

          points_out[idx].x += FT_MulFix( deltas_x[j], apply );
          points_out[idx].y += FT_MulFix( deltas_y[j], apply );
        }

        /* no need to handle phantom points here,      */
        /* since solitary points can't be interpolated */
        tt_interpolate_deltas( outline,
                               points_out,
                               points_org,
                               has_delta );

        FT_TRACE7(( "    point deltas:\n" ));

        for ( j = 0; j < n_points; j++ )
        {
          FT_Fixed  old_point_delta_x = point_deltas_x[j];
          FT_Fixed  old_point_delta_y = point_deltas_y[j];

          FT_Pos  point_delta_x = points_out[j].x - points_org[j].x;
          FT_Pos  point_delta_y = points_out[j].y - points_org[j].y;


          point_deltas_x[j] = old_point_delta_x + point_delta_x;
          point_deltas_y[j] = old_point_delta_y + point_delta_y;

#ifdef FT_DEBUG_LEVEL_TRACE
          if ( point_delta_x || point_delta_y )
          {
            FT_TRACE7(( "      %d: (%f, %f) -> (%f, %f)\n",
                        j,
                        (double)( FT_intToFixed( outline->points[j].x ) +
                                    old_point_delta_x ) / 65536,
                        (double)( FT_intToFixed( outline->points[j].y ) +
                                    old_point_delta_y ) / 65536,
                        (double)( FT_intToFixed( outline->points[j].x ) +
                                    point_deltas_x[j] ) / 65536,
                        (double)( FT_intToFixed( outline->points[j].y ) +
                                    point_deltas_y[j] ) / 65536 ));
            count++;
          }
#endif
        }

#ifdef FT_DEBUG_LEVEL_TRACE
        if ( !count )
          FT_TRACE7(( "      none\n" ));
#endif
      }

      if ( localpoints != ALL_POINTS )
        FT_FREE( localpoints );
      FT_FREE( deltas_x );
      FT_FREE( deltas_y );

      offsetToData += tupleDataSize;

      FT_Stream_SeekSet( stream, here );
    }

    FT_TRACE5(( "\n" ));

    /* To avoid double adjustment of advance width or height, */
    /* do not move phantom points if there is HVAR or VVAR    */
    /* support, respectively.                                 */
    if ( face->variation_support & TT_FACE_FLAG_VAR_HADVANCE )
    {
      point_deltas_x[n_points - 4] = 0;
      point_deltas_y[n_points - 4] = 0;
      point_deltas_x[n_points - 3] = 0;
      point_deltas_y[n_points - 3] = 0;
    }
    if ( face->variation_support & TT_FACE_FLAG_VAR_VADVANCE )
    {
      point_deltas_x[n_points - 2] = 0;
      point_deltas_y[n_points - 2] = 0;
      point_deltas_x[n_points - 1] = 0;
      point_deltas_y[n_points - 1] = 0;
    }

    for ( i = 0; i < n_points; i++ )
    {
      unrounded[i].x += FT_fixedToFdot6( point_deltas_x[i] );
      unrounded[i].y += FT_fixedToFdot6( point_deltas_y[i] );

      outline->points[i].x += FT_fixedToInt( point_deltas_x[i] );
      outline->points[i].y += FT_fixedToInt( point_deltas_y[i] );
    }

    /* To avoid double adjustment of advance width or height, */
    /* adjust phantom points only if there is no HVAR or VVAR */
    /* support, respectively.                                 */
    if ( !( face->variation_support & TT_FACE_FLAG_VAR_HADVANCE ) )
    {
      loader->pp1      = outline->points[n_points - 4];
      loader->pp2      = outline->points[n_points - 3];
      loader->linear   = FT_PIX_ROUND( unrounded[n_points - 3].x -
                                       unrounded[n_points - 4].x ) / 64;
    }
    if ( !( face->variation_support & TT_FACE_FLAG_VAR_VADVANCE ) )
    {
      loader->pp3      = outline->points[n_points - 2];
      loader->pp4      = outline->points[n_points - 1];
      loader->vadvance = FT_PIX_ROUND( unrounded[n_points - 1].y -
                                       unrounded[n_points - 2].y ) / 64;
    }

  Fail3:
    FT_FREE( point_deltas_x );
    FT_FREE( point_deltas_y );

  Fail2:
    if ( sharedpoints != ALL_POINTS )
      FT_FREE( sharedpoints );
    FT_FREE( tuple_coords );
    FT_FREE( im_start_coords );
    FT_FREE( im_end_coords );

    FT_FRAME_EXIT();

  Fail1:
    FT_FREE( points_org );
    FT_FREE( points_out );
    FT_FREE( has_delta );

    return error;
  }